

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O2

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalGet(wasm::LocalGet__
          (void *this,LocalGet *curr)

{
  reference rVar1;
  LocalGet *local_20;
  LocalGet *curr_local;
  
  local_20 = curr;
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)((long)this + 0xd8),(ulong)curr->index);
  if ((*rVar1._M_p & rVar1._M_mask) != 0) {
    std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
              ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
               ((ulong)curr->index * 0x18 + *(long *)((long)this + 0x118)),&local_20);
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        if (relevant[curr->index]) {
          getsForLocal[curr->index].push_back(curr);
        }
      }